

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaDebug.cpp
# Opt level: O1

HighsDebugStatus __thiscall
HSimplexNla::debugReportInvertSolutionError
          (HSimplexNla *this,string *source,bool transposed,double solve_error_norm,
          double residual_error_norm,bool force)

{
  HighsOptions *pHVar1;
  HighsLogType HVar2;
  HighsLogType HVar3;
  HighsDebugStatus HVar4;
  string value_adjective;
  string type;
  undefined1 *local_78;
  char *local_70;
  undefined1 local_68 [16];
  double local_58;
  undefined1 *local_50;
  char *local_48;
  undefined1 local_40 [16];
  
  pHVar1 = this->options_;
  local_70 = (char *)0x0;
  local_68[0] = 0;
  local_50 = local_40;
  local_78 = local_68;
  local_58 = residual_error_norm;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50);
  if (transposed) {
    std::__cxx11::string::_M_replace((ulong)&local_50,0,local_48,0x3df43a);
  }
  if ((solve_error_norm != 0.0) || (NAN(solve_error_norm))) {
    if (solve_error_norm <= kSolveExcessiveError) {
      if (solve_error_norm <= 1e-08) {
        HVar3 = kInfo;
        std::__cxx11::string::_M_replace((ulong)&local_78,0,local_70,0x3da99f);
      }
      else {
        HVar3 = kWarning;
        std::__cxx11::string::_M_replace((ulong)&local_78,0,local_70,0x3d3bc7);
      }
    }
    else {
      HVar3 = kError;
      std::__cxx11::string::_M_replace((ulong)&local_78,0,local_70,0x3d3bbd);
    }
    HVar2 = kInfo;
    if (!force) {
      HVar2 = HVar3;
    }
    highsLogDev(&(pHVar1->super_HighsOptionsStruct).log_options,HVar2,
                "CheckINVERT:   %-9s (%9.4g) norm for %s%s solve error\n",solve_error_norm,local_78,
                local_50,(source->_M_dataplus)._M_p);
  }
  if ((local_58 != 0.0) || (NAN(local_58))) {
    if (local_58 <= kResidualExcessiveError) {
      if (local_58 <= 1e-08) {
        HVar4 = kOk;
        HVar3 = kInfo;
        std::__cxx11::string::_M_replace((ulong)&local_78,0,local_70,0x3da99f);
      }
      else {
        std::__cxx11::string::_M_replace((ulong)&local_78,0,local_70,0x3d3bc7);
        HVar4 = kWarning;
        HVar3 = kWarning;
      }
    }
    else {
      std::__cxx11::string::_M_replace((ulong)&local_78,0,local_70,0x3d3bbd);
      HVar4 = kError;
      HVar3 = kError;
    }
    HVar2 = kInfo;
    if (!force) {
      HVar2 = HVar3;
    }
    highsLogDev(&(pHVar1->super_HighsOptionsStruct).log_options,HVar2,
                "CheckINVERT:   %-9s (%9.4g) norm for %s%s residual error\n",local_58,local_78,
                local_50,(source->_M_dataplus)._M_p);
  }
  else {
    HVar4 = kOk;
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  return HVar4;
}

Assistant:

HighsDebugStatus HSimplexNla::debugReportInvertSolutionError(
    const std::string source, const bool transposed,
    const double solve_error_norm, const double residual_error_norm,
    const bool force) const {
  const HighsOptions* options = this->options_;
  std::string value_adjective;
  HighsLogType report_level;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  std::string type = "";
  if (transposed) type = "transposed ";
  if (solve_error_norm) {
    if (solve_error_norm > kSolveExcessiveError) {
      value_adjective = "Excessive";
      report_level = HighsLogType::kError;
    } else if (solve_error_norm > kSolveLargeError) {
      value_adjective = "Large";
      report_level = HighsLogType::kWarning;
    } else {
      value_adjective = "Small";
      report_level = HighsLogType::kInfo;
    }
    if (force) report_level = HighsLogType::kInfo;
    //    printf("%s\n", value_adjective.c_str());
    //    printf("%g\n", solve_error_norm);
    //    printf("%s\n", type.c_str());
    //    printf("%s\n", source.c_str());
    highsLogDev(options->log_options, report_level,
                "CheckINVERT:   %-9s (%9.4g) norm for %s%s solve error\n",
                value_adjective.c_str(), solve_error_norm, type.c_str(),
                source.c_str());
  }

  if (residual_error_norm) {
    if (residual_error_norm > kResidualExcessiveError) {
      value_adjective = "Excessive";
      report_level = HighsLogType::kError;
      return_status = HighsDebugStatus::kError;
    } else if (residual_error_norm > kResidualLargeError) {
      value_adjective = "Large";
      report_level = HighsLogType::kWarning;
      return_status = HighsDebugStatus::kWarning;
    } else {
      value_adjective = "Small";
      report_level = HighsLogType::kInfo;
    }
    if (force) report_level = HighsLogType::kInfo;
    highsLogDev(options->log_options, report_level,
                "CheckINVERT:   %-9s (%9.4g) norm for %s%s "
                "residual error\n",
                value_adjective.c_str(), residual_error_norm, type.c_str(),
                source.c_str());
  }
  return return_status;
}